

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_uuid_unlink(intptr_t uuid,void *obj)

{
  char cVar1;
  fio_uuid_links__ordered_s_ *pfVar2;
  long lVar3;
  fio_data_s *pfVar4;
  int iVar5;
  fio_uuid_links__map_s_ *pfVar6;
  int *piVar7;
  long lVar8;
  fio_uuid_link_fn obj_00;
  long *plVar9;
  long lVar10;
  uint uVar11;
  fio_lock_i ret_1;
  fio_lock_i ret;
  
  if ((uuid < 0) || (uVar11 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar11)) {
LAB_0010592c:
    piVar7 = __errno_location();
    *piVar7 = 9;
    return -1;
  }
  lVar10 = (long)(int)uVar11 * 0xa8;
  cVar1 = *(char *)((long)fio_data + lVar10 + 0x6d);
  if (cVar1 != (char)uuid) goto LAB_0010592c;
  fio_lock((fio_lock_i *)((long)fio_data + lVar10 + 0x6e));
  pfVar4 = fio_data;
  if ((fio_data->capa <= uVar11) || (*(char *)((long)fio_data + lVar10 + 0x6d) != cVar1)) {
    LOCK();
    *(undefined1 *)((long)fio_data + lVar10 + 0x6e) = 0;
    UNLOCK();
    goto LAB_0010592c;
  }
  if (obj != (void *)0x0) {
    pfVar6 = fio_uuid_links__find_map_pos_
                       ((fio_uuid_links_s *)((long)fio_data + lVar10 + 0xb8),(uintptr_t)obj,obj_00);
    if ((pfVar6 != (fio_uuid_links__map_s_ *)0x0) &&
       (pfVar2 = pfVar6->pos, pfVar2 != (fio_uuid_links__ordered_s_ *)0x0)) {
      plVar9 = (long *)((long)pfVar4 + lVar10 + 0xb8);
      *plVar9 = *plVar9 + -1;
      pfVar2->hash = 0;
      lVar8 = *(long *)((long)pfVar4 + lVar10 + 200);
      lVar3 = *(long *)((long)pfVar4 + lVar10 + 0xd0);
      if (pfVar2 == (fio_uuid_links__ordered_s_ *)(lVar3 + lVar8 * 0x10 + -0x10)) {
        pfVar6->hash = 0;
        plVar9 = (long *)(lVar8 * 0x10 + lVar3 + -0x20);
        do {
          lVar8 = lVar8 + -1;
          if (lVar8 == 0) break;
          lVar3 = *plVar9;
          plVar9 = plVar9 + -2;
        } while (lVar3 == 0);
        *(long *)((long)pfVar4 + lVar10 + 200) = lVar8;
      }
      pfVar6->pos = (fio_uuid_links__ordered_s_ *)0x0;
      iVar5 = 0;
      goto LAB_00105953;
    }
  }
  piVar7 = __errno_location();
  *piVar7 = 0x6b;
  iVar5 = -1;
LAB_00105953:
  LOCK();
  *(undefined1 *)((long)fio_data + lVar10 + 0x6e) = 0;
  UNLOCK();
  return iVar5;
}

Assistant:

int fio_uuid_unlink(intptr_t uuid, void *obj) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  /* default object comparison is always true */
  int ret =
      fio_uuid_links_remove(&uuid_data(uuid).links, (uintptr_t)obj, NULL, NULL);
  if (ret)
    errno = ENOTCONN;
  fio_unlock(&uuid_data(uuid).sock_lock);
  return ret;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  return -1;
}